

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O0

bool __thiscall ON_COMPONENT_INDEX::IsAnnotationComponentIndex(ON_COMPONENT_INDEX *this)

{
  bool local_11;
  bool rc;
  ON_COMPONENT_INDEX *this_local;
  
  local_11 = false;
  if (this->m_type - dim_linear_point < 5) {
    local_11 = -1 < this->m_index;
  }
  return local_11;
}

Assistant:

bool ON_COMPONENT_INDEX::IsAnnotationComponentIndex() const
{
  bool rc = false;
  switch(m_type)
  {
  case ON_COMPONENT_INDEX::dim_linear_point:
  case ON_COMPONENT_INDEX::dim_radial_point:
  case ON_COMPONENT_INDEX::dim_angular_point:
  case ON_COMPONENT_INDEX::dim_ordinate_point:
  case ON_COMPONENT_INDEX::dim_text_point:
    if ( m_index >= 0 )
    {
      rc = true;
    }
    break;
  default:
    // intentionally skipping other ON_COMPONENT_INDEX::TYPE enum values
    break;
  }
  return rc;
}